

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc.c
# Opt level: O3

void ipc_on_connection_tcp_conn(uv_stream_t *server,int status)

{
  int iVar1;
  uint uVar2;
  uv_loop_t *puVar3;
  undefined8 uVar4;
  void *pvVar5;
  undefined8 *extraout_RDX;
  uv_pipe_t *puVar6;
  uv_pipe_t *puVar7;
  uv_loop_t *puVar8;
  uv_write_t *puVar9;
  uv_tcp_t *puVar10;
  ulong uVar11;
  undefined1 auStack_a8 [16];
  uv_pipe_t *puStack_98;
  undefined1 auStack_90 [16];
  undefined1 auStack_80 [16];
  uv_pipe_t *puStack_70;
  undefined1 auStack_60 [8];
  code *pcStack_58;
  uv_pipe_t *puStack_50;
  undefined1 local_18 [16];
  
  if (status == 0) {
    puVar9 = (uv_write_t *)server;
    if (server != (uv_stream_t *)&tcp_server) goto LAB_00162ced;
    puVar9 = (uv_write_t *)0xf8;
    puVar3 = (uv_loop_t *)malloc(0xf8);
    if (puVar3 == (uv_loop_t *)0x0) goto LAB_00162cf2;
    puVar8 = puVar3;
    puVar9 = (uv_write_t *)tcp_server.loop;
    iVar1 = uv_tcp_init();
    status = (int)puVar8;
    if (iVar1 != 0) goto LAB_00162cf7;
    puVar10 = &tcp_server;
    puVar8 = puVar3;
    iVar1 = uv_accept();
    status = (int)puVar8;
    puVar9 = (uv_write_t *)puVar10;
    if (iVar1 != 0) goto LAB_00162cfc;
    local_18 = uv_buf_init("hello\n",6);
    puVar9 = &conn_notify_req;
    status = 0x2e6b38;
    iVar1 = uv_write2(&conn_notify_req,&channel,local_18,1,puVar3,0);
    if (iVar1 != 0) goto LAB_00162d01;
    status = 0x163441;
    puVar9 = (uv_write_t *)puVar3;
    iVar1 = uv_read_start(puVar3,on_read_alloc,on_tcp_child_process_read);
    if (iVar1 == 0) {
      uv_close(puVar3,close_cb);
      return;
    }
  }
  else {
    ipc_on_connection_tcp_conn_cold_1();
    puVar9 = (uv_write_t *)server;
LAB_00162ced:
    ipc_on_connection_tcp_conn_cold_2();
LAB_00162cf2:
    ipc_on_connection_tcp_conn_cold_7();
LAB_00162cf7:
    ipc_on_connection_tcp_conn_cold_3();
LAB_00162cfc:
    ipc_on_connection_tcp_conn_cold_4();
LAB_00162d01:
    ipc_on_connection_tcp_conn_cold_5();
  }
  ipc_on_connection_tcp_conn_cold_6();
  if (status == 0) {
    iVar1 = uv_read_start(((uv_loop_t *)puVar9)->pending_queue[0],on_read_alloc,
                          on_tcp_child_process_read);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    connect_child_process_cb_cold_1();
  }
  connect_child_process_cb_cold_2();
  memset(buffer,0x2e,100000);
  large_buf = (uv_buf_t)uv_buf_init(buffer,100000);
  uVar4 = uv_default_loop();
  iVar1 = uv_pipe_init(uVar4,&channel,1);
  if (iVar1 == 0) {
    puVar6 = &channel;
    uv_pipe_open(&channel,0);
    iVar1 = uv_is_readable(&channel);
    if (iVar1 != 1) goto LAB_00162e37;
    iVar1 = uv_is_writable(&channel);
    if (iVar1 != 1) goto LAB_00162e3c;
    iVar1 = uv_is_closing(&channel);
    if (iVar1 != 0) goto LAB_00162e41;
    uVar2 = write_until_data_queued();
    if (uVar2 != 0) {
      send_handle_and_close();
    }
    uVar4 = uv_default_loop();
    iVar1 = uv_run(uVar4,0);
    if (iVar1 != 0) goto LAB_00162e46;
    if (closed_handle_write == '\0') goto LAB_00162e4b;
    puVar6 = (uv_pipe_t *)uv_default_loop();
    uv_walk(puVar6,close_walk_cb,0);
    uv_run(puVar6,0);
    uVar4 = uv_default_loop();
    iVar1 = uv_loop_close(uVar4);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    ipc_helper_closed_handle_cold_1();
    puVar6 = (uv_pipe_t *)buffer;
LAB_00162e37:
    ipc_helper_closed_handle_cold_2();
LAB_00162e3c:
    ipc_helper_closed_handle_cold_3();
LAB_00162e41:
    ipc_helper_closed_handle_cold_4();
LAB_00162e46:
    ipc_helper_closed_handle_cold_5();
LAB_00162e4b:
    ipc_helper_closed_handle_cold_6();
  }
  ipc_helper_closed_handle_cold_7();
  uVar11 = 0;
  puVar7 = (uv_pipe_t *)write_reqs;
  puStack_50 = puVar6;
  while( true ) {
    pcStack_58 = (code *)0x162e93;
    iVar1 = uv_write(puVar7,&channel,&large_buf,1,closed_handle_large_write_cb);
    if (iVar1 != 0) break;
    if (0x12a < uVar11) {
      return;
    }
    uVar11 = uVar11 + 1;
    puVar7 = (uv_pipe_t *)puVar7->write_queue;
    if (channel.write_queue_size != 0) {
      return;
    }
  }
  pcStack_58 = send_handle_and_close;
  write_until_data_queued_cold_1();
  puStack_70 = (uv_pipe_t *)0x162ece;
  uVar4 = uv_default_loop();
  puStack_70 = (uv_pipe_t *)0x162edd;
  iVar1 = uv_tcp_init(uVar4,&tcp_server);
  if (iVar1 == 0) {
    puStack_70 = (uv_pipe_t *)0x162ef7;
    iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,auStack_60);
    if (iVar1 != 0) goto LAB_00162f5b;
    puStack_70 = (uv_pipe_t *)0x162f0e;
    iVar1 = uv_tcp_bind(&tcp_server,auStack_60,0);
    if (iVar1 != 0) goto LAB_00162f60;
    puStack_70 = (uv_pipe_t *)0x162f3f;
    iVar1 = uv_write2(&write_req,&channel,&large_buf,1,&tcp_server,closed_handle_write_cb);
    if (iVar1 == 0) {
      puStack_70 = (uv_pipe_t *)0x162f51;
      uv_close(&tcp_server,0);
      return;
    }
  }
  else {
    puStack_70 = (uv_pipe_t *)0x162f5b;
    send_handle_and_close_cold_1();
LAB_00162f5b:
    puStack_70 = (uv_pipe_t *)0x162f60;
    send_handle_and_close_cold_2();
LAB_00162f60:
    puStack_70 = (uv_pipe_t *)0x162f65;
    send_handle_and_close_cold_3();
  }
  puStack_70 = (uv_pipe_t *)ipc_helper_bind_twice;
  send_handle_and_close_cold_4();
  puStack_98 = (uv_pipe_t *)0x162f85;
  puStack_70 = puVar7;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,auStack_80);
  if (iVar1 == 0) {
    puStack_98 = (uv_pipe_t *)0x162f92;
    uVar4 = uv_default_loop();
    puStack_98 = (uv_pipe_t *)0x162fa6;
    iVar1 = uv_pipe_init(uVar4,&channel,1);
    if (iVar1 != 0) goto LAB_0016312f;
    puVar7 = &channel;
    puStack_98 = (uv_pipe_t *)0x162fbf;
    uv_pipe_open(&channel,0);
    puStack_98 = (uv_pipe_t *)0x162fc7;
    iVar1 = uv_is_readable(&channel);
    if (iVar1 != 1) goto LAB_00163134;
    puStack_98 = (uv_pipe_t *)0x162fdc;
    iVar1 = uv_is_writable(&channel);
    if (iVar1 != 1) goto LAB_00163139;
    puStack_98 = (uv_pipe_t *)0x162ff1;
    iVar1 = uv_is_closing(&channel);
    if (iVar1 != 0) goto LAB_0016313e;
    puStack_98 = (uv_pipe_t *)0x16300a;
    auStack_90 = uv_buf_init("hello\n",6);
    puStack_98 = (uv_pipe_t *)0x163018;
    uVar4 = uv_default_loop();
    puStack_98 = (uv_pipe_t *)0x163027;
    iVar1 = uv_tcp_init(uVar4,&tcp_server);
    if (iVar1 != 0) goto LAB_00163143;
    puStack_98 = (uv_pipe_t *)0x163034;
    uVar4 = uv_default_loop();
    puStack_98 = (uv_pipe_t *)0x163043;
    iVar1 = uv_tcp_init(uVar4,&tcp_server2);
    if (iVar1 != 0) goto LAB_00163148;
    puStack_98 = (uv_pipe_t *)0x16305e;
    iVar1 = uv_tcp_bind(&tcp_server,auStack_80,0);
    if (iVar1 != 0) goto LAB_0016314d;
    puStack_98 = (uv_pipe_t *)0x163079;
    iVar1 = uv_tcp_bind(&tcp_server2,auStack_80,0);
    if (iVar1 != 0) goto LAB_00163152;
    puStack_98 = (uv_pipe_t *)0x1630a6;
    iVar1 = uv_write2(&write_req,&channel,auStack_90,1,&tcp_server,0);
    if (iVar1 != 0) goto LAB_00163157;
    puStack_98 = (uv_pipe_t *)0x1630d3;
    iVar1 = uv_write2(&write_req2,&channel,auStack_90,1,&tcp_server2,0);
    if (iVar1 != 0) goto LAB_0016315c;
    puStack_98 = (uv_pipe_t *)0x1630e0;
    uVar4 = uv_default_loop();
    puStack_98 = (uv_pipe_t *)0x1630ea;
    iVar1 = uv_run(uVar4,0);
    if (iVar1 != 0) goto LAB_00163161;
    puStack_98 = (uv_pipe_t *)0x1630f3;
    puVar7 = (uv_pipe_t *)uv_default_loop();
    puStack_98 = (uv_pipe_t *)0x163107;
    uv_walk(puVar7,close_walk_cb,0);
    puStack_98 = (uv_pipe_t *)0x163111;
    uv_run(puVar7,0);
    puStack_98 = (uv_pipe_t *)0x163116;
    uVar4 = uv_default_loop();
    puStack_98 = (uv_pipe_t *)0x16311e;
    iVar1 = uv_loop_close(uVar4);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    puStack_98 = (uv_pipe_t *)0x16312f;
    ipc_helper_bind_twice_cold_1();
LAB_0016312f:
    puStack_98 = (uv_pipe_t *)0x163134;
    ipc_helper_bind_twice_cold_2();
LAB_00163134:
    puStack_98 = (uv_pipe_t *)0x163139;
    ipc_helper_bind_twice_cold_3();
LAB_00163139:
    puStack_98 = (uv_pipe_t *)0x16313e;
    ipc_helper_bind_twice_cold_4();
LAB_0016313e:
    puStack_98 = (uv_pipe_t *)0x163143;
    ipc_helper_bind_twice_cold_5();
LAB_00163143:
    puStack_98 = (uv_pipe_t *)0x163148;
    ipc_helper_bind_twice_cold_6();
LAB_00163148:
    puStack_98 = (uv_pipe_t *)0x16314d;
    ipc_helper_bind_twice_cold_7();
LAB_0016314d:
    puStack_98 = (uv_pipe_t *)0x163152;
    ipc_helper_bind_twice_cold_8();
LAB_00163152:
    puStack_98 = (uv_pipe_t *)0x163157;
    ipc_helper_bind_twice_cold_9();
LAB_00163157:
    puStack_98 = (uv_pipe_t *)0x16315c;
    ipc_helper_bind_twice_cold_10();
LAB_0016315c:
    puStack_98 = (uv_pipe_t *)0x163161;
    ipc_helper_bind_twice_cold_11();
LAB_00163161:
    puStack_98 = (uv_pipe_t *)0x163166;
    ipc_helper_bind_twice_cold_12();
  }
  puStack_98 = (uv_pipe_t *)ipc_helper_send_zero;
  ipc_helper_bind_twice_cold_13();
  puStack_98 = puVar7;
  auStack_a8 = uv_buf_init(0,0);
  uVar4 = uv_default_loop();
  puVar6 = &channel;
  iVar1 = uv_pipe_init(uVar4,&channel,0);
  if (iVar1 == 0) {
    puVar6 = (uv_pipe_t *)0x0;
    uv_pipe_open(&channel);
    iVar1 = uv_is_readable(&channel);
    if (iVar1 != 1) goto LAB_0016326e;
    iVar1 = uv_is_writable(&channel);
    if (iVar1 != 1) goto LAB_00163273;
    iVar1 = uv_is_closing(&channel);
    if (iVar1 != 0) goto LAB_00163278;
    puVar6 = &channel;
    iVar1 = uv_write(&write_req,&channel,auStack_a8,1,send_zero_write_cb);
    if (iVar1 != 0) goto LAB_0016327d;
    uVar4 = uv_default_loop();
    puVar6 = (uv_pipe_t *)0x0;
    iVar1 = uv_run(uVar4);
    if (iVar1 != 0) goto LAB_00163282;
    if (send_zero_write == 1) {
      uVar4 = uv_default_loop();
      uv_walk(uVar4,close_walk_cb,0);
      puVar6 = (uv_pipe_t *)0x0;
      uv_run(uVar4);
      uVar4 = uv_default_loop();
      iVar1 = uv_loop_close(uVar4);
      if (iVar1 == 0) {
        return;
      }
      goto LAB_0016328c;
    }
  }
  else {
    ipc_helper_send_zero_cold_1();
LAB_0016326e:
    ipc_helper_send_zero_cold_2();
LAB_00163273:
    ipc_helper_send_zero_cold_3();
LAB_00163278:
    ipc_helper_send_zero_cold_4();
LAB_0016327d:
    ipc_helper_send_zero_cold_5();
LAB_00163282:
    ipc_helper_send_zero_cold_6();
  }
  ipc_helper_send_zero_cold_7();
LAB_0016328c:
  ipc_helper_send_zero_cold_8();
  if ((int)puVar6 != 0) {
    send_zero_write_cb_cold_1();
    pvVar5 = malloc((size_t)puVar6);
    *extraout_RDX = pvVar5;
    extraout_RDX[1] = puVar6;
    return;
  }
  send_zero_write = send_zero_write + 1;
  return;
}

Assistant:

static void ipc_on_connection_tcp_conn(uv_stream_t* server, int status) {
  int r;
  uv_buf_t buf;
  uv_tcp_t* conn;

  ASSERT(status == 0);
  ASSERT((uv_stream_t*)&tcp_server == server);

  conn = malloc(sizeof(*conn));
  ASSERT(conn);

  r = uv_tcp_init(server->loop, conn);
  ASSERT(r == 0);

  r = uv_accept(server, (uv_stream_t*)conn);
  ASSERT(r == 0);

  /* Send the accepted connection to the other process */
  buf = uv_buf_init("hello\n", 6);
  r = uv_write2(&conn_notify_req, (uv_stream_t*)&channel, &buf, 1,
    (uv_stream_t*)conn, NULL);
  ASSERT(r == 0);

  r = uv_read_start((uv_stream_t*) conn,
                    on_read_alloc,
                    on_tcp_child_process_read);
  ASSERT(r == 0);

  uv_close((uv_handle_t*)conn, close_cb);
}